

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_ugawg_node(REF_NODE ref_node,REF_INT version)

{
  double __x;
  undefined1 auVar1 [16];
  uint uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_c8 [4];
  undefined8 local_a8;
  double local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  double local_80;
  double local_78;
  undefined8 local_70;
  double local_68;
  double local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  
  if (version - 1U < 2) {
    lVar4 = 1;
    for (lVar3 = 0; lVar3 < ref_node->max; lVar3 = lVar3 + 1) {
      if (-1 < ref_node->global[lVar3]) {
        dVar5 = ref_node->real[lVar4 + -1];
        dVar6 = ref_node->real[lVar4];
        __x = atan2(dVar6,dVar5);
        dVar5 = SQRT(dVar5 * dVar5 + dVar6 * dVar6) + -0.5;
        if (dVar5 <= -dVar5) {
          dVar5 = -dVar5;
        }
        dVar7 = dVar5 * 0.198 + 0.001;
        dVar6 = 0.1;
        if (version == 2) {
          dVar5 = dVar5 * 10.0;
          if (1.0 <= dVar5) {
            dVar5 = 1.0;
          }
          dVar6 = dVar5 * 0.1 + (1.0 - dVar5) * 0.025;
        }
        auVar1._8_8_ = dVar6 * dVar6;
        auVar1._0_8_ = dVar7 * dVar7;
        local_98 = divpd(_DAT_001f8be0,auVar1);
        local_88 = 0x4058ffffffffffff;
        local_80 = cos(__x);
        local_78 = sin(__x);
        local_70 = 0;
        local_68 = sin(__x);
        local_68 = -local_68;
        local_60 = cos(__x);
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0;
        local_40 = 0x3ff0000000000000;
        ref_matrix_form_m((REF_DBL *)local_98,local_c8);
        uVar2 = ref_node_metric_set(ref_node,(REF_INT)lVar3,local_c8);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x136,"ref_metric_ugawg_node",(ulong)uVar2,"set node met");
          return uVar2;
        }
      }
      lVar4 = lVar4 + 0xf;
    }
  }
  else {
    if (version != 3) {
      return 6;
    }
    lVar4 = 1;
    for (lVar3 = 0; lVar3 < ref_node->max; lVar3 = lVar3 + 1) {
      if (-1 < ref_node->global[lVar3]) {
        dVar5 = ref_node->real[lVar4];
        if (2.0 - dVar5 <= dVar5) {
          dVar5 = 2.0 - dVar5;
        }
        dVar6 = tanh(dVar5 * 2.3 + -0.96);
        local_c8[0] = pow(dVar6 * 0.042 + 0.088,-2.0);
        local_c8[1] = 0.0;
        local_c8[2] = 0.0;
        dVar6 = tanh(dVar5 * 3.4);
        local_c8[3] = pow(dVar6 * 0.06 + 0.0022,-2.0);
        local_a8 = 0;
        dVar5 = tanh(dVar5 * 1.2 + -0.24);
        local_a0 = pow(dVar5 * 0.08 + 0.045,-2.0);
        uVar2 = ref_node_metric_set(ref_node,(REF_INT)lVar3,local_c8);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x14d,"ref_metric_ugawg_node",(ulong)uVar2,"set node met");
          return uVar2;
        }
      }
      lVar4 = lVar4 + 0xf;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_ugawg_node(REF_NODE ref_node, REF_INT version) {
  REF_INT node;
  REF_DBL x, y, r, t;
  REF_DBL h_z, h_t, h_r, h0, d0;
  REF_DBL d[12], m[6];

  if (1 == version || 2 == version) {
    each_ref_node_valid_node(ref_node, node) {
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      r = sqrt(x * x + y * y);
      t = atan2(y, x);
      h_z = 0.1;
      h_t = 0.1;
      h0 = 0.001;
      h_r = h0 + 2 * (0.1 - h0) * ABS(r - 0.5);
      if (2 == version) {
        d0 = MIN(10.0 * ABS(r - 0.5), 1.0);
        h_t = 0.1 * d0 + 0.025 * (1.0 - d0);
      }
      ref_matrix_eig(d, 0) = 1.0 / (h_r * h_r);
      ref_matrix_eig(d, 1) = 1.0 / (h_t * h_t);
      ref_matrix_eig(d, 2) = 1.0 / (h_z * h_z);
      ref_matrix_vec(d, 0, 0) = cos(t);
      ref_matrix_vec(d, 1, 0) = sin(t);
      ref_matrix_vec(d, 2, 0) = 0.0;
      ref_matrix_vec(d, 0, 1) = -sin(t);
      ref_matrix_vec(d, 1, 1) = cos(t);
      ref_matrix_vec(d, 2, 1) = 0.0;
      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_form_m(d, m);
      RSS(ref_node_metric_set(ref_node, node, m), "set node met");
    }
    return REF_SUCCESS;
  }

  if (3 == version) { /* larsson3 */
    each_ref_node_valid_node(ref_node, node) {
      REF_DBL h = 1.0;
      REF_DBL dd;
      REF_DBL factor = 1.0;

      y = ref_node_xyz(ref_node, 1, node);

      dd = MIN(y, 2 * h - y);
      m[0] = factor * pow(h, -2) *
             pow(0.088 + 0.042 * tanh(2.3 * dd / h - 0.96), -2);
      m[1] = 0.0;
      m[2] = 0.0;
      m[3] = factor * pow(h, -2) * pow(0.0022 + 0.06 * tanh(3.4 * dd / h), -2);
      m[4] = 0.0;
      m[5] = factor * pow(h, -2) *
             pow(0.045 + 0.08 * tanh(1.2 * dd / h - 0.24), -2);

      RSS(ref_node_metric_set(ref_node, node, m), "set node met");
    }
    return REF_SUCCESS;
  }
  return REF_IMPLEMENT;
}